

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetCMakePropertyCommand.cxx
# Opt level: O0

bool cmGetCMakePropertyCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  string_view value;
  undefined8 name;
  cmExecutionStatus *this;
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  cmGlobalGenerator *this_00;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *rng;
  ulong uVar4;
  cmMakefile *pcVar5;
  cmState *this_01;
  string *psVar6;
  cmValue local_128;
  cmValue prop;
  string local_110;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_f0;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *components;
  string local_e0;
  cmValue local_c0;
  cmValue macrosProp;
  string local_b0;
  cmValue local_90;
  cmValue varsProp;
  string local_80 [8];
  string output;
  string *variable;
  allocator<char> local_41;
  string local_40;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  this = local_20;
  if (sVar2 < 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"called with incorrect number of arguments",&local_41);
    cmExecutionStatus::SetError(this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    args_local._7_1_ = 0;
  }
  else {
    output.field_2._8_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)status_local,0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_80,"NOTFOUND",(allocator<char> *)((long)&varsProp.Value + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&varsProp.Value + 7));
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)status_local,1);
    bVar1 = std::operator==(pvVar3,"VARIABLES");
    if (bVar1) {
      pcVar5 = cmExecutionStatus::GetMakefile(local_20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,"VARIABLES",(allocator<char> *)((long)&macrosProp.Value + 7));
      local_90 = cmMakefile::GetProperty(pcVar5,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&macrosProp.Value + 7));
      bVar1 = cmValue::operator_cast_to_bool(&local_90);
      if (bVar1) {
        psVar6 = cmValue::operator*[abi_cxx11_(&local_90);
        std::__cxx11::string::operator=(local_80,(string *)psVar6);
      }
    }
    else {
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)status_local,1);
      bVar1 = std::operator==(pvVar3,"MACROS");
      if (bVar1) {
        std::__cxx11::string::clear();
        pcVar5 = cmExecutionStatus::GetMakefile(local_20);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e0,"MACROS",(allocator<char> *)((long)&components + 7));
        local_c0 = cmMakefile::GetProperty(pcVar5,&local_e0);
        std::__cxx11::string::~string((string *)&local_e0);
        std::allocator<char>::~allocator((allocator<char> *)((long)&components + 7));
        bVar1 = cmValue::operator_cast_to_bool(&local_c0);
        if (bVar1) {
          psVar6 = cmValue::operator*[abi_cxx11_(&local_c0);
          std::__cxx11::string::operator=(local_80,(string *)psVar6);
        }
      }
      else {
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)status_local,1);
        bVar1 = std::operator==(pvVar3,"COMPONENTS");
        if (bVar1) {
          pcVar5 = cmExecutionStatus::GetMakefile(local_20);
          this_00 = cmMakefile::GetGlobalGenerator(pcVar5);
          rng = cmGlobalGenerator::GetInstallComponents_abi_cxx11_(this_00);
          local_f0 = rng;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)&prop,";");
          cmJoin<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                    (&local_110,rng,_prop);
          std::__cxx11::string::operator=(local_80,(string *)&local_110);
          std::__cxx11::string::~string((string *)&local_110);
        }
        else {
          cmValue::cmValue(&local_128,(nullptr_t)0x0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)status_local,1);
          uVar4 = std::__cxx11::string::empty();
          if ((uVar4 & 1) == 0) {
            pcVar5 = cmExecutionStatus::GetMakefile(local_20);
            this_01 = cmMakefile::GetState(pcVar5);
            pvVar3 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)status_local,1);
            local_128 = cmState::GetGlobalProperty(this_01,pvVar3);
          }
          bVar1 = cmValue::operator_cast_to_bool(&local_128);
          if (bVar1) {
            psVar6 = cmValue::operator*[abi_cxx11_(&local_128);
            std::__cxx11::string::operator=(local_80,(string *)psVar6);
          }
        }
      }
    }
    pcVar5 = cmExecutionStatus::GetMakefile(local_20);
    name = output.field_2._8_8_;
    value = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_80);
    cmMakefile::AddDefinition(pcVar5,(string *)name,value);
    args_local._7_1_ = 1;
    std::__cxx11::string::~string(local_80);
  }
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool cmGetCMakePropertyCommand(std::vector<std::string> const& args,
                               cmExecutionStatus& status)
{
  if (args.size() < 2) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  std::string const& variable = args[0];
  std::string output = "NOTFOUND";

  if (args[1] == "VARIABLES") {
    if (cmValue varsProp = status.GetMakefile().GetProperty("VARIABLES")) {
      output = *varsProp;
    }
  } else if (args[1] == "MACROS") {
    output.clear();
    if (cmValue macrosProp = status.GetMakefile().GetProperty("MACROS")) {
      output = *macrosProp;
    }
  } else if (args[1] == "COMPONENTS") {
    const std::set<std::string>* components =
      status.GetMakefile().GetGlobalGenerator()->GetInstallComponents();
    output = cmJoin(*components, ";");
  } else {
    cmValue prop = nullptr;
    if (!args[1].empty()) {
      prop = status.GetMakefile().GetState()->GetGlobalProperty(args[1]);
    }
    if (prop) {
      output = *prop;
    }
  }

  status.GetMakefile().AddDefinition(variable, output);

  return true;
}